

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_token_attr<tinyusdz::UsdUVTexture::SourceColorSpace>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                   *attr,string *name,uint32_t indent)

{
  Path *v;
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  uint32_t indent_00;
  size_type *psVar4;
  uint32_t n;
  SourceColorSpace v_00;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n_01;
  long lVar5;
  tinyusdz *this;
  char *pcVar6;
  storage_t<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_> *psVar7;
  stringstream ss;
  string local_248;
  string *local_228;
  string *local_220;
  string local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  indent_00 = indent;
  local_228 = name;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((((attr->_empty == false) && ((attr->_attrib).has_value_ == false)) &&
      ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start)) && (attr->_blocked != true)) goto LAB_00180392;
  psVar7 = (storage_t<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_> *)
           &attr->_fallback;
  if ((attr->_attrib).has_value_ != false) {
    psVar7 = &(attr->_attrib).contained;
  }
  bVar1 = AttrMetas::authored(&attr->_metas);
  local_220 = __return_storage_ptr__;
  if (((bVar1) || (*(bool *)((long)psVar7 + 4) != false)) ||
     ((n_01 = n,
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start &&
      ((attr->_empty != false || (((attr->_attrib).has_value_ & 1U) == 0)))))) {
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)indent,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"token ",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(local_228->_M_dataplus)._M_p,local_228->_M_string_length);
    this = (tinyusdz *)0x1d8f33;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    if (*(bool *)((long)psVar7 + 5) == true) {
      pcVar6 = "None";
      lVar5 = 4;
LAB_001800c9:
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,lVar5);
    }
    else {
      if (*(bool *)((long)psVar7 + 4) == true) {
        this = (tinyusdz *)(ulong)*(SourceColorSpace *)psVar7;
      }
      if (*(bool *)((long)psVar7 + 4) == false) {
        pcVar6 = "[Animatable: InternalError]";
        lVar5 = 0x1b;
        goto LAB_001800c9;
      }
      to_string_abi_cxx11_(&local_1d8,this,v_00);
      local_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\"","");
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,local_1f8,local_1f0 + (long)local_1f8);
      std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1d8._M_dataplus._M_p);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1f8);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_218.field_2._M_allocated_capacity = *psVar4;
        local_218.field_2._8_8_ = plVar3[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar4;
        local_218._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_218._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      indent_00 = (uint32_t)psVar4;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_
                (&local_248,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
      pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)indent,n_00);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_220;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        __return_storage_ptr__ = local_220;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if (*(bool *)((long)psVar7 + 0x20) == true) {
    TypedTimeSamples<tinyusdz::UsdUVTexture::SourceColorSpace>::update
              ((TypedTimeSamples<tinyusdz::UsdUVTexture::SourceColorSpace> *)((long)psVar7 + 8));
    n_01 = extraout_EDX_00;
  }
  if (*(pointer *)((long)psVar7 + 0x10) !=
      (((TypedTimeSamples<tinyusdz::UsdUVTexture::SourceColorSpace> *)((long)psVar7 + 8))->_samples)
      .
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::SourceColorSpace>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::SourceColorSpace>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)indent,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"token ",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(local_228->_M_dataplus)._M_p,local_228->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".timeSamples = ",0xf);
    print_typed_token_timesamples<tinyusdz::UsdUVTexture::SourceColorSpace>
              (&local_248,
               (TypedTimeSamples<tinyusdz::UsdUVTexture::SourceColorSpace> *)((long)psVar7 + 8),
               indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    __return_storage_ptr__ = local_220;
    n_01 = extraout_EDX_01;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)indent,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"token ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(local_228->_M_dataplus)._M_p,local_228->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar5 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar5 == 1) {
      std::operator<<(local_1a8,v);
    }
    else {
      std::operator<<(local_1a8,&attr->_paths);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
LAB_00180392:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    if (attr.metas().authored() || v.has_value() || attr.is_value_empty()) {
      ss << pprint::Indent(indent);
      ss << "token " << name << " = ";
      if (v.is_blocked()) {
        ss << "None";
      } else {
        T a;
        if (v.get_scalar(&a)) {
          ss << quote(to_string(a));
        } else { 
          ss << "[Animatable: InternalError]";
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {

      ss << pprint::Indent(indent);
      ss << "token " << name << ".timeSamples = ";

      ss << print_typed_token_timesamples(v.get_timesamples(), indent);
      ss << "\n";
    }


    if (attr.has_connections()) {
      ss << pprint::Indent(indent);

      ss << "token " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }


  return ss.str();
}